

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_keypair_free(NTRUKeyPair *keypair)

{
  ring_free(keypair->h,keypair->p);
  ring_free(keypair->f3,keypair->p);
  ring_free(keypair->ginv,keypair->p);
  ring_free(keypair->rho,keypair->p);
  safefree(keypair);
  return;
}

Assistant:

void ntru_keypair_free(NTRUKeyPair *keypair)
{
    ring_free(keypair->h, keypair->p);
    ring_free(keypair->f3, keypair->p);
    ring_free(keypair->ginv, keypair->p);
    ring_free(keypair->rho, keypair->p);
    sfree(keypair);
}